

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scala_kbm.cpp
# Opt level: O0

kbm * scala::read_kbm(kbm *__return_storage_ptr__,ifstream *input_file)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  runtime_error *prVar4;
  double dVar5;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_b0;
  undefined1 local_90 [8];
  regex EX;
  regex COMMENT_REGEX;
  int local_3c;
  undefined1 local_38 [4];
  uint current_entry;
  string buffer;
  ifstream *input_file_local;
  kbm *keyboard_mapping;
  
  buffer.field_2._8_8_ = input_file;
  std::__cxx11::string::string((string *)local_38);
  local_3c = 0;
  kbm::kbm(__return_storage_ptr__);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &EX._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,"[ \t]*!.*",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_90,"^[ \t]*[xX]{1}.*",
             0x10);
  while (bVar1 = std::ios::operator_cast_to_bool
                           ((ios *)(buffer.field_2._8_8_ +
                                   *(long *)(*(long *)buffer.field_2._8_8_ + -0x18))), bVar1) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)buffer.field_2._8_8_,(string *)local_38);
    bVar1 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38
                       ,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                        &EX._M_automaton.
                         super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount,0);
    if (!bVar1) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&local_b0,"[ \t]*",0x10);
      bVar1 = std::
              regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_38,&local_b0,0);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_b0);
      if (!bVar1) {
        switch(local_3c) {
        case 0:
          iVar2 = std::__cxx11::stoi((string *)local_38,(size_t *)0x0,10);
          __return_storage_ptr__->map_size = iVar2;
          local_3c = local_3c + 1;
          break;
        case 1:
          iVar2 = std::__cxx11::stoi((string *)local_38,(size_t *)0x0,10);
          __return_storage_ptr__->first_note = iVar2;
          local_3c = local_3c + 1;
          break;
        case 2:
          iVar2 = std::__cxx11::stoi((string *)local_38,(size_t *)0x0,10);
          __return_storage_ptr__->last_note = iVar2;
          local_3c = local_3c + 1;
          break;
        case 3:
          iVar2 = std::__cxx11::stoi((string *)local_38,(size_t *)0x0,10);
          __return_storage_ptr__->middle_note = iVar2;
          local_3c = local_3c + 1;
          break;
        case 4:
          iVar2 = std::__cxx11::stoi((string *)local_38,(size_t *)0x0,10);
          __return_storage_ptr__->reference_note = iVar2;
          local_3c = local_3c + 1;
          break;
        case 5:
          dVar5 = std::__cxx11::stod((string *)local_38,(size_t *)0x0);
          __return_storage_ptr__->reference_frequency = dVar5;
          local_3c = local_3c + 1;
          break;
        case 6:
          iVar2 = std::__cxx11::stoi((string *)local_38,(size_t *)0x0,10);
          __return_storage_ptr__->octave_degree = iVar2;
          local_3c = local_3c + 1;
          break;
        case 7:
          bVar1 = std::
                  regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_38,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                      local_90,0);
          if (bVar1) {
            kbm::add_mapping(__return_storage_ptr__,-1);
          }
          else {
            iVar2 = std::__cxx11::stoi((string *)local_38,(size_t *)0x0,10);
            kbm::add_mapping(__return_storage_ptr__,iVar2);
          }
        }
      }
    }
  }
  iVar2 = __return_storage_ptr__->map_size;
  sVar3 = std::vector<int,_std::allocator<int>_>::size(&__return_storage_ptr__->mapping);
  if ((long)iVar2 != sVar3) {
    iVar2 = __return_storage_ptr__->map_size;
    sVar3 = std::vector<int,_std::allocator<int>_>::size(&__return_storage_ptr__->mapping);
    if ((ulong)(long)iVar2 < sVar3) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,"ERROR: Too few entires in mapping file");
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"ERROR: Too many entires in mapping file");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_90);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &EX._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

kbm read_kbm(std::ifstream& input_file){
        std::string buffer;
        unsigned int current_entry = 0;
        kbm keyboard_mapping;

#ifdef SCALA_STRICT
        std::regex COMMENT_REGEX = std::regex("^!.*");
        std::regex EX = std::regex("^[ \t]*[x]{1}.*");
#else
        std::regex COMMENT_REGEX = std::regex("[ \t]*!.*");
        std::regex EX = std::regex("^[ \t]*[xX]{1}.*");
#endif
    
        while(input_file){
            getline(input_file, buffer);
            if (std::regex_match (buffer, COMMENT_REGEX)) {
                // Ignore comments
            } else if (std::regex_match (buffer, std::regex("[ \t]*") )) {
                // Blank line. If we're in strict mode this means end of file.
                // Stop parsing.
#ifdef SCALA_STRICT
                break;
#endif
            } else {
                switch(current_entry){
                    case MAP_SIZE: 
                        keyboard_mapping.map_size = std::stoi(buffer);
                        current_entry += 1;
                        break;
                    case FIRST_NOTE: 
                        keyboard_mapping.first_note = std::stoi(buffer);
                        current_entry += 1;
                        break;
                    case LAST_NOTE: 
                        keyboard_mapping.last_note = std::stoi(buffer);
                        current_entry += 1;
                        break;
                    case MIDDLE_NOTE: 
                        keyboard_mapping.middle_note = std::stoi(buffer);
                        current_entry += 1;
                        break;
                    case REFERENCE_NOTE: 
                        keyboard_mapping.reference_note = std::stoi(buffer);
                        current_entry += 1;
                        break;
                    case REFERENCE_FREQUENCY: 
                        keyboard_mapping.reference_frequency = std::stod(buffer);
                        current_entry += 1;
                        break;
                    case OCTAVE_DEGREE: 
                        keyboard_mapping.octave_degree = std::stoi(buffer);
                        current_entry += 1;
                        break;
                    case ACTUAL_MAP:
                        // This one is a little more complicated.  If we have an x
                        if (std::regex_match (buffer, EX)) {
                            // A non-entry
                            keyboard_mapping.add_mapping(KBM_NON_ENTRY);
                        } else {
                            // A mapping entry
                            keyboard_mapping.add_mapping(std::stoi(buffer));
                        }
                }
            }
        }
        if (static_cast <size_t> (keyboard_mapping.map_size) != keyboard_mapping.mapping.size()){
            // This is an error, strict mode or not 
            if (static_cast <size_t> (keyboard_mapping.map_size) < keyboard_mapping.mapping.size()){
                throw std::runtime_error("ERROR: Too few entires in mapping file");
            } else {
                throw std::runtime_error("ERROR: Too many entires in mapping file");
            }
        }
        return keyboard_mapping;
    }